

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O1

void __thiscall
gulcalc::output_mean_mode1
          (gulcalc *this,OASIS_FLOAT tiv,prob_mean *pp,int bin_count,OASIS_FLOAT *gul_mean,
          OASIS_FLOAT *std_dev,OASIS_FLOAT *max_loss,vector<int,_std::allocator<int>_> *bin_ids)

{
  map<prob_mean,_int,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
  *this_00;
  pointer *pppVar1;
  float fVar2;
  iterator __position;
  iterator __position_00;
  size_t sVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  int iVar6;
  OASIS_FLOAT OVar7;
  float fVar8;
  float fVar9;
  float local_68;
  
  *gul_mean = 0.0;
  *std_dev = 0.0;
  fVar8 = 0.0;
  if (0 < bin_count) {
    this_00 = &this->bin_map_;
    local_68 = 0.0;
    iVar6 = 0;
    do {
      iVar4 = std::
              _Rb_tree<prob_mean,_std::pair<const_prob_mean,_int>,_std::_Select1st<std::pair<const_prob_mean,_int>_>,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
              ::find(&this_00->_M_t,pp);
      if ((_Rb_tree_header *)iVar4._M_node == &(this->bin_map_)._M_t._M_impl.super__Rb_tree_header)
      {
        sVar3 = (this->bin_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        pmVar5 = std::
                 map<prob_mean,_int,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
                 ::operator[](this_00,pp);
        *pmVar5 = (mapped_type)sVar3;
        __position._M_current =
             (this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<prob_mean,std::allocator<prob_mean>>::_M_realloc_insert<prob_mean_const&>
                    ((vector<prob_mean,std::allocator<prob_mean>> *)&this->bin_lookup_,__position,pp
                    );
        }
        else {
          OVar7 = pp->bin_mean;
          (__position._M_current)->prob_to = pp->prob_to;
          (__position._M_current)->bin_mean = OVar7;
          pppVar1 = &(this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
      }
      pmVar5 = std::
               map<prob_mean,_int,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
               ::operator[](this_00,pp);
      __position_00._M_current =
           (bin_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position_00._M_current ==
          (bin_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)bin_ids,__position_00,pmVar5);
      }
      else {
        *__position_00._M_current = *pmVar5;
        (bin_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position_00._M_current + 1;
      }
      fVar9 = 0.0;
      if (iVar6 != 0) {
        fVar9 = local_68;
      }
      local_68 = pp->prob_to;
      fVar2 = pp->bin_mean;
      fVar9 = (local_68 - fVar9) * fVar2;
      *gul_mean = fVar9 * tiv + *gul_mean;
      fVar8 = fVar8 + fVar2 * fVar9 * tiv * tiv;
      pp = pp + 1;
      iVar6 = iVar6 + 1;
    } while (bin_count != iVar6);
  }
  fVar8 = fVar8 - *gul_mean * *gul_mean;
  fVar9 = 0.0;
  if (0.0 <= fVar8) {
    fVar9 = fVar8;
  }
  if (fVar9 < 0.0) {
    OVar7 = sqrtf(fVar9);
  }
  else {
    OVar7 = SQRT(fVar9);
  }
  *std_dev = OVar7;
  *max_loss = tiv * (this->damagebindictionary_vec_->
                    super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>).
                    _M_impl.super__Vector_impl_data._M_start[(long)bin_count + -1].bin_to;
  return;
}

Assistant:

void gulcalc::output_mean_mode1(const OASIS_FLOAT tiv, prob_mean *pp,
				const int bin_count, OASIS_FLOAT &gul_mean,
				OASIS_FLOAT &std_dev, OASIS_FLOAT &max_loss,
				std::vector<int> &bin_ids) {

	OASIS_FLOAT last_prob_to = 0;
	gul_mean = 0;
	std_dev = 0;
	OASIS_FLOAT ctr_var = 0;

	for (int bin_index = 0; bin_index < bin_count; bin_index++) {

		// Map prob_mean to integer for later lookup
		auto pos = bin_map_.find(*pp);
		if (pos == bin_map_.end()) {
			bin_map_[*pp] = bin_map_.size();
			bin_lookup_.push_back(*pp);
		}
		bin_ids.push_back(bin_map_[*pp]);

		probrec p;
		if (bin_index == 0) {
			p.prob_from = 0;
		} else {
			p.prob_from = last_prob_to;
		}
		p.prob_to = pp->prob_to;
		p.bin_mean = pp->bin_mean;
		last_prob_to = pp->prob_to;
		gul_mean = gul_mean + ((p.prob_to - p.prob_from) * p.bin_mean * tiv);
		ctr_var = ctr_var + ((p.prob_to - p.prob_from) * p.bin_mean * p.bin_mean * tiv * tiv);
		pp++;
	}

	OASIS_FLOAT g2 = gul_mean * gul_mean;
	std_dev = ctr_var - g2;
	if (std_dev < 0) std_dev = 0;
	std_dev = sqrt(std_dev);

	max_loss = tiv * (*damagebindictionary_vec_)[bin_count - 1].bin_to;
}